

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void __thiscall VmValue::AddUse(VmValue *this,VmValue *user)

{
  bool bVar1;
  VmValue *local_18;
  VmValue *user_local;
  VmValue *this_local;
  
  local_18 = user;
  user_local = this;
  bVar1 = VmType::operator!=(&this->type,&VmType::Void);
  if (!bVar1) {
    __assert_fail("type != VmType::Void",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x76b,"void VmValue::AddUse(VmValue *)");
  }
  this->hasKnownSimpleUse = false;
  SmallArray<VmValue_*,_8U>::push_back(&this->users,&local_18);
  return;
}

Assistant:

void VmValue::AddUse(VmValue* user)
{
	// Can't use empty values
	assert(type != VmType::Void);

	// New user might not be simple
	hasKnownSimpleUse = false;

	users.push_back(user);
}